

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O0

void __thiscall
lr_grammar::GrammarLR::calculate_expression_first
          (GrammarLR *this,int elemIndex,int expressionIndex,
          vector<int,_std::allocator<int>_> *result,bool choose)

{
  bool bVar1;
  ulong uVar2;
  reference pvVar3;
  reference pvVar4;
  size_type sVar5;
  Express *pEVar6;
  int *piVar7;
  reference pvVar8;
  long lVar9;
  reference pvVar10;
  value_type local_78;
  int local_74;
  undefined1 local_70 [4];
  int j;
  vector<int,_std::allocator<int>_> tmpF;
  undefined1 local_40 [4];
  int length;
  vector<int,_std::allocator<int>_> notNULL;
  int i;
  bool choose_local;
  vector<int,_std::allocator<int>_> *result_local;
  int expressionIndex_local;
  int elemIndex_local;
  GrammarLR *this_local;
  
  notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = choose;
  result_local._0_4_ = expressionIndex;
  result_local._4_4_ = elemIndex;
  _expressionIndex_local = this;
  std::vector<int,_std::allocator<int>_>::clear(result);
  notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  do {
    uVar2 = (ulong)(int)notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
    pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)result_local._4_4_);
    pvVar4 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::operator[]
                       (&pvVar3->expression_of_set,(long)(int)result_local);
    sVar5 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)pvVar4);
    if (sVar5 <= uVar2) {
      return;
    }
    pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::operator[]
                       (&this->elements,(long)result_local._4_4_);
    pEVar6 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::operator[]
                        (&pvVar3->expression_of_set,(long)(int)result_local)->super_Express;
    piVar7 = base_grammar::Express::operator[]
                       (pEVar6,(int)notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
    if (*piVar7 == result_local._4_4_) {
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->first,(long)result_local._4_4_);
      bVar1 = public_tool::is_in_vector(pvVar8,-1);
      if (!bVar1) {
        if ((notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._7_1_ & 1) == 0) {
          return;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->first_temp,(value_type *)&result_local);
        return;
      }
    }
    else {
      pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)result_local._4_4_);
      pEVar6 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                operator[](&pvVar3->expression_of_set,(long)(int)result_local)->super_Express;
      piVar7 = base_grammar::Express::operator[]
                         (pEVar6,(int)notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
      bVar1 = get_first(this,*piVar7);
      if (!bVar1) {
        bVar1 = public_tool::is_in_vector(result,-1);
        if (bVar1) {
          return;
        }
        local_78 = -1;
        std::vector<int,_std::allocator<int>_>::push_back(result,&local_78);
        return;
      }
      lVar9 = (long)(int)notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
      pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)result_local._4_4_);
      pvVar4 = std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
               operator[](&pvVar3->expression_of_set,(long)(int)result_local);
      sVar5 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)pvVar4);
      if (lVar9 == sVar5 - 1) {
        pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                 operator[](&this->elements,(long)result_local._4_4_);
        pEVar6 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                  operator[](&pvVar3->expression_of_set,(long)(int)result_local)->super_Express;
        piVar7 = base_grammar::Express::operator[]
                           (pEVar6,(int)notNULL.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->first,(long)*piVar7);
        public_tool::connect_vector(result,pvVar8);
      }
      else {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_40);
        pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                 operator[](&this->elements,(long)result_local._4_4_);
        pEVar6 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                  operator[](&pvVar3->expression_of_set,(long)(int)result_local)->super_Express;
        piVar7 = base_grammar::Express::operator[]
                           (pEVar6,(int)notNULL.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->first,(long)*piVar7);
        sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar8);
        pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
                 operator[](&this->elements,(long)result_local._4_4_);
        pEVar6 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                  operator[](&pvVar3->expression_of_set,(long)(int)result_local)->super_Express;
        piVar7 = base_grammar::Express::operator[]
                           (pEVar6,(int)notNULL.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->first,(long)*piVar7);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_70,pvVar8);
        for (local_74 = 0; local_74 < (int)sVar5; local_74 = local_74 + 1) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_70,(long)local_74);
          if (*pvVar10 != -1) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_70,(long)local_74);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_40,pvVar10);
          }
        }
        public_tool::connect_vector(result,(vector<int,_std::allocator<int>_> *)local_40);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_70);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_40);
      }
      pvVar3 = std::vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>::
               operator[](&this->elements,(long)result_local._4_4_);
      pEVar6 = &std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::
                operator[](&pvVar3->expression_of_set,(long)(int)result_local)->super_Express;
      piVar7 = base_grammar::Express::operator[]
                         (pEVar6,(int)notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
      pvVar8 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->first,(long)*piVar7);
      bVar1 = public_tool::is_in_vector(pvVar8,-1);
      if (!bVar1) {
        return;
      }
    }
    notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)notNULL.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage + 1;
  } while( true );
}

Assistant:

void  GrammarLR::calculate_expression_first(int elemIndex, int expressionIndex, vector<int>& result, bool choose){

    result.clear();
    //vector<int>::iterator it =elements[elemIndex].expression_of_set[expressionIndex].expression.begin() ;
    //vector<int>::iterator end = elements[elemIndex].expression_of_set[expressionIndex].expression.end();




    for (int i = 0; i < elements[elemIndex].expression_of_set[expressionIndex].expression.size(); i++){

        //对于这种情况有没有可能出现：
        //A->TAb|c|T
        //T->@|t
        //进行递归了
        if (elements[elemIndex].expression_of_set[expressionIndex][i] == elemIndex) {

            //后续处理
            if (public_tool::is_in_vector(first[elemIndex], -1)) continue;
            else{
                if (choose) this->first_temp.push_back(expressionIndex);
                break;
            }

        }

        if (get_first(elements[elemIndex].expression_of_set[expressionIndex][i])){

            if (i == elements[elemIndex].expression_of_set[expressionIndex].expression.size() - 1){
                public_tool::connect_vector(result, first[elements[elemIndex].expression_of_set[expressionIndex][i]]);
            }
            else
            {
                vector<int> notNULL;//将空串除去
                int length = first[elements[elemIndex].expression_of_set[expressionIndex][i]].size();
                vector<int> tmpF = first[elements[elemIndex].expression_of_set[expressionIndex][i]];
                for (int j = 0; j < length; j++){
                    if (tmpF[j] != -1){
                        notNULL.push_back(tmpF[j]);
                    }
                }
                public_tool::connect_vector(result, notNULL);
            }

        }
        else
        {
            if (!public_tool::is_in_vector(result, -1)) result.push_back(-1);
            break;
        }

        //-1不在这个式子里面后面不用继续了
        if (!public_tool::is_in_vector(first[elements[elemIndex].expression_of_set[expressionIndex][i]], -1)) break;

    }
}